

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O3

bool __thiscall
Indexing::ClauseCodeTree::removeOneOfAlternatives
          (ClauseCodeTree *this,CodeOp *op,Clause *cl,
          Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks)

{
  ulong uVar1;
  CodeOp **ppCVar2;
  ulong uVar3;
  
  uVar3 = op->_content;
  if (((Clause *)(uVar3 >> 3) != cl || (uVar3 & 7) != 0) || uVar3 == 0) {
    ppCVar2 = firstsInBlocks->_cursor;
    uVar3 = (long)ppCVar2 - (long)firstsInBlocks->_stack;
    do {
      op = op->_alternative;
      if (op == (CodeOp *)0x0) {
        firstsInBlocks->_cursor = firstsInBlocks->_stack + (uVar3 >> 3 & 0xffffffff);
        return false;
      }
      if (ppCVar2 == firstsInBlocks->_end) {
        Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(firstsInBlocks);
        ppCVar2 = firstsInBlocks->_cursor;
      }
      *ppCVar2 = op;
      ppCVar2 = firstsInBlocks->_cursor + 1;
      firstsInBlocks->_cursor = ppCVar2;
      uVar1 = op->_content;
    } while (((Clause *)(uVar1 >> 3) != cl || (uVar1 & 7) != 0) || uVar1 == 0);
  }
  op->_content = 0;
  CodeTree::optimizeMemoryAfterRemoval(&this->super_CodeTree,firstsInBlocks,op);
  return true;
}

Assistant:

bool ClauseCodeTree::removeOneOfAlternatives(CodeOp* op, Clause* cl, Stack<CodeOp*>* firstsInBlocks)
{
  unsigned initDepth=firstsInBlocks->size();

  while(!op->isSuccess() || op->getSuccessResult<Clause>()!=cl) {
    op=op->alternative();
    if(!op) {
      firstsInBlocks->truncate(initDepth);
      return false;
    }
    firstsInBlocks->push(op);
  }
  op->makeFail();
  optimizeMemoryAfterRemoval(firstsInBlocks, op);
  return true;
}